

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O3

MemoryRegionSection * phys_page_find(AddressSpaceDispatch *d,hwaddr addr)

{
  MemoryRegionSection *pMVar1;
  ulong uVar2;
  MemoryRegionSection *pMVar3;
  PhysPageEntry PVar4;
  int iVar6;
  uint uVar7;
  ulong uVar5;
  
  pMVar3 = (d->map).sections;
  PVar4 = d->phys_map;
  uVar7 = (uint)PVar4 & 0x3f;
  if (uVar7 != 0) {
    iVar6 = 6;
    do {
      iVar6 = iVar6 - uVar7;
      if (iVar6 < 0) break;
      if ((uint)PVar4 >> 6 == 0x3ffffff) {
        return pMVar3;
      }
      PVar4 = (d->map).nodes[(uint)PVar4 >> 6]
              [(uint)((addr >> 0xe) >> ((char)iVar6 * '\t' & 0x3fU)) & 0x1ff];
      uVar7 = (uint)PVar4 & 0x3f;
    } while (uVar7 != 0);
  }
  uVar5 = (ulong)((uint)PVar4 & 0xffffffc0);
  pMVar1 = (MemoryRegionSection *)((long)&pMVar3->size + uVar5);
  if ((*(long *)((long)&pMVar3->size + uVar5 + 8) != 0) ||
     (uVar2 = pMVar1->offset_within_address_space,
     addr <= (*(long *)((long)&pMVar3->size + uVar5) + uVar2) - 1 && uVar2 <= addr)) {
    pMVar3 = pMVar1;
  }
  return pMVar3;
}

Assistant:

static MemoryRegionSection *phys_page_find(AddressSpaceDispatch *d, hwaddr addr)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = d->uc;
#endif
    PhysPageEntry lp = d->phys_map, *p;
    Node *nodes = d->map.nodes;
    MemoryRegionSection *sections = d->map.sections;
    hwaddr index = addr >> TARGET_PAGE_BITS;
    int i;

    for (i = P_L2_LEVELS; lp.skip && (i -= lp.skip) >= 0;) {
        if (lp.ptr == PHYS_MAP_NODE_NIL) {
            return &sections[PHYS_SECTION_UNASSIGNED];
        }
        p = nodes[lp.ptr];
        lp = p[(index >> (i * P_L2_BITS)) & (P_L2_SIZE - 1)];
    }

    if (section_covers_addr(&sections[lp.ptr], addr)) {
        return &sections[lp.ptr];
    } else {
        return &sections[PHYS_SECTION_UNASSIGNED];
    }
}